

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GetProcAddressExtensionCase::executeTest(GetProcAddressExtensionCase *this)

{
  CallLogWrapper *this_00;
  string *extName;
  ostringstream *poVar1;
  TestLog *pTVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  deUint32 err;
  __eglMustCastToProperFunctionPointerType p_Var6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  long local_1b8;
  MessageBuilder local_1b0;
  
  pTVar2 = ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  extName = &this->m_extName;
  bVar4 = GetProcAddressCase::isSupported(&this->super_GetProcAddressCase,extName);
  uVar10 = 0;
  lVar3 = 0;
  do {
    lVar7 = lVar3;
    if (lVar7 + 0x18 == 0xee8) {
      local_1b8 = 0;
      goto LAB_00238940;
    }
    bVar5 = std::operator==(extName,*(char **)((long)&(anonymous_namespace)::s_extensions + lVar7));
    lVar3 = lVar7 + 0x18;
  } while (!bVar5);
  uVar10 = *(uint *)((long)&DAT_003da7e8 + lVar7);
  local_1b8 = *(long *)((long)&PTR_s_EGL_ANDROID_blob_cache_003da7f0 + lVar7);
LAB_00238940:
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,(string *)extName);
  std::operator<<((ostream *)poVar1,": ");
  pcVar9 = "not supported";
  if (bVar4) {
    pcVar9 = "supported";
  }
  std::operator<<((ostream *)poVar1,pcVar9);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  local_1b0.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  this_00 = &(this->super_GetProcAddressCase).super_CallLogWrapper;
  poVar1 = &local_1b0.m_str;
  uVar8 = 0;
  uVar11 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = uVar8;
  }
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    pcVar9 = *(char **)(local_1b8 + uVar8 * 8);
    p_Var6 = eglu::CallLogWrapper::eglGetProcAddress(this_00,pcVar9);
    err = eglu::CallLogWrapper::eglGetError(this_00);
    eglu::checkError(err,"eglGetProcAddress()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetProcAddressTests.cpp"
                     ,0xcc);
    if (p_Var6 == (__eglMustCastToProperFunctionPointerType)0x0 && bVar4) {
      local_1b0.m_log = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,
                      "Fail, received null pointer for supported extension function: ");
      std::operator<<((ostream *)poVar1,pcVar9);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      tcu::TestContext::setTestResult
                ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Unexpected null pointer");
    }
  }
  return;
}

Assistant:

void executeTest (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		bool					supported	= isSupported(m_extName);
		const FunctionNames		funcNames	= getExtFunctionNames(m_extName);

		DE_ASSERT(funcNames.numFunctions > 0);

		log << TestLog::Message << m_extName << ": " << (supported ? "supported" : "not supported") << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;

		for (int funcNdx = 0; funcNdx < funcNames.numFunctions; funcNdx++)
		{
			const char*	funcName		= funcNames.functions[funcNdx];
			void		(*funcPtr)(void);

			funcPtr = eglGetProcAddress(funcName);
			eglu::checkError(eglGetError(), "eglGetProcAddress()", __FILE__, __LINE__);

			if (supported && funcPtr == 0)
			{
				log << TestLog::Message << "Fail, received null pointer for supported extension function: " << funcName << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected null pointer");
			}
		}
	}